

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::fill<fmt::v7::detail::buffer_appender<char>,char>
          (buffer_appender<char> it,size_t n,fill_t<char> *fill)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    if (n != 0) {
      cVar2 = fill->data_[0];
      do {
        lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10);
        uVar4 = lVar3 + 1;
        if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                      + 0x18) < uVar4) {
          (*(code *)**(undefined8 **)
                      it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
          lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10);
          uVar4 = lVar3 + 1;
        }
        *(ulong *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x10) = uVar4;
        *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 8) + lVar3) = cVar2;
        n = n - 1;
      } while (n != 0);
    }
  }
  else if (n != 0) {
    do {
      if (bVar1 != 0) {
        it = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                       (fill->data_,fill->data_ + bVar1,it);
      }
      n = n - 1;
    } while (n != 0);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         it.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

FMT_NOINLINE OutputIt fill(OutputIt it, size_t n, const fill_t<Char>& fill) {
  auto fill_size = fill.size();
  if (fill_size == 1) return std::fill_n(it, n, fill[0]);
  for (size_t i = 0; i < n; ++i) it = std::copy_n(fill.data(), fill_size, it);
  return it;
}